

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImVec2>::resize(ImVector<ImVec2> *this,int new_size)

{
  int iVar1;
  
  iVar1 = this->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar1 / 2 + iVar1;
    }
    if (iVar1 <= new_size) {
      iVar1 = new_size;
    }
    reserve(this,iVar1);
  }
  this->Size = new_size;
  return;
}

Assistant:

inline int          _grow_capacity(int sz) const        { int new_capacity = Capacity ? (Capacity + Capacity/2) : 8; return new_capacity > sz ? new_capacity : sz; }